

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O1

MPP_RET hal_jpege_vepu1_part_start(void *hal,HalEncTask *task)

{
  RK_U32 RVar1;
  RK_U32 start_mbrow;
  undefined4 uVar2;
  JpegeSyntax *syntax;
  long lVar3;
  int iVar4;
  MPP_RET MVar5;
  MPP_RET MVar6;
  char *fmt;
  RK_U32 RVar7;
  uint uVar8;
  uint uVar9;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  syntax = (JpegeSyntax *)(task->syntax).data;
  RVar1 = syntax->mcu_hor_cnt;
  uVar8 = syntax->mcu_ver_cnt;
  start_mbrow = *(RK_U32 *)((long)hal + 0x104);
  RVar7 = syntax->part_rows;
  lVar3 = *(long *)((long)hal + 0x18);
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter part start %p\n","hal_jpege_vepu1_part_start",hal);
  }
  task->part_first = (uint)(start_mbrow == 0);
  if (start_mbrow + RVar7 < uVar8) {
    task->part_last = 0;
    uVar9 = 0x1000000;
    uVar8 = 0;
  }
  else {
    RVar7 = syntax->height + start_mbrow * -0x10 + 0xf >> 4;
    iVar4 = *(int *)((long)hal + 0x124);
    task->part_last = 1;
    uVar8 = iVar4 << 6;
    uVar9 = 0;
  }
  if (((byte)hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","part first %d last %d\n",(char *)0x0,(ulong)(start_mbrow == 0),
               (ulong)task->part_last);
  }
  get_msb_lsb_at_pos((RK_U32 *)(lVar3 + 0x58),(RK_U32 *)(lVar3 + 0x5c),
                     *(RK_U8 **)((long)hal + 0x108),*(RK_U32 *)((long)hal + 0x11c));
  *(int *)(lVar3 + 0x60) = *(int *)((long)hal + 0x110) - *(int *)((long)hal + 0x11c);
  *(uint *)(lVar3 + 0x3c) = *(uint *)(lVar3 + 0x3c) & 0xfffffc3f | uVar8;
  *(uint *)(lVar3 + 0x94) = (*(uint *)((long)hal + 0x11c) & 7) << 0x1a;
  iVar4 = mpp_buffer_get_fd_with_caller(task->output,"hal_jpege_vepu1_part_start");
  *(int *)(lVar3 + 0x14) = iVar4;
  if (*(RK_U32 *)((long)hal + 0x11c) != 0) {
    mpp_dev_set_reg_offset(*hal,5,*(RK_U32 *)((long)hal + 0x11c));
  }
  *(RK_U32 *)(lVar3 + 0x38) = RVar7 << 10 | RVar1 << 0x13 | 0x8000000d;
  *(uint *)(lVar3 + 0x50) = uVar9 | jpege_restart_marker[*(uint *)((long)hal + 0x128) & 7];
  *(int *)((long)hal + 0x128) = *(int *)((long)hal + 0x128) + 1;
  hal_jpege_vepu1_set_extra_info(*hal,syntax,start_mbrow);
  *(int *)((long)hal + 0x104) = *(int *)((long)hal + 0x104) + RVar7;
  uVar2 = *(undefined4 *)((long)hal + 0x28);
  local_40 = *(undefined8 *)((long)hal + 0x18);
  local_34 = 0;
  local_38 = uVar2;
  MVar5 = mpp_dev_ioctl(*hal,4,&local_40);
  if (MVar5 == MPP_OK) {
    local_50 = *(undefined8 *)((long)hal + 0x20);
    local_44 = 0;
    local_48 = uVar2;
    MVar5 = mpp_dev_ioctl(*hal,5,&local_50);
    if (MVar5 == MPP_OK) {
      MVar6 = mpp_dev_ioctl(*hal,0xf,(void *)0x0);
      MVar5 = MPP_OK;
      if (MVar6 != MPP_OK) {
        _mpp_log_l(2,"hal_jpege_vepu1","send cmd failed %d\n","hal_jpege_vepu1_part_start",
                   (ulong)(uint)MVar6);
        MVar5 = MVar6;
      }
      goto LAB_0024b491;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_jpege_vepu1",fmt,"hal_jpege_vepu1_part_start",(ulong)(uint)MVar5);
LAB_0024b491:
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","leave part start %p\n","hal_jpege_vepu1_part_start",hal);
  }
  return MVar5;
}

Assistant:

static MPP_RET hal_jpege_vepu1_part_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    JpegeSyntax *syntax = (JpegeSyntax *)task->syntax.data;
    RK_U32 mcu_w = syntax->mcu_hor_cnt;
    RK_U32 mcu_h = syntax->mcu_ver_cnt;
    RK_U32 mcu_y = ctx->mcu_y;
    RK_U32 part_mcu_h = syntax->part_rows;
    RK_U32 *regs = (RK_U32 *)ctx->regs;
    RK_U32 part_enc_h;
    RK_U32 part_enc_mcu_h;
    RK_U32 part_y_fill;
    RK_U32 part_not_end;

    hal_jpege_dbg_func("enter part start %p\n", hal);

    /* Fix register for each part encoding */
    task->part_first = !mcu_y;
    if (mcu_y + part_mcu_h < mcu_h) {
        part_enc_h = part_mcu_h * 16;
        part_enc_mcu_h = part_mcu_h;
        part_y_fill = 0;
        part_not_end = 1;
        task->part_last = 0;
    } else {
        part_enc_h = syntax->height - mcu_y * 16;
        part_enc_mcu_h = MPP_ALIGN(part_enc_h, 16) / 16;;
        part_y_fill = ctx->part_y_fill;
        part_not_end = 0;
        task->part_last = 1;
    }

    hal_jpege_dbg_detail("part first %d last %d\n", task->part_first, task->part_last);

    get_msb_lsb_at_pos(&regs[22], &regs[23], ctx->base, ctx->part_bytepos);

    regs[24] = ctx->size - ctx->part_bytepos;

    regs[15] = (regs[15] & 0xfffffc3f) | (part_y_fill << 6);

    regs[37] = ((ctx->part_bytepos & 7) * 8) << 23;

    regs[5] = mpp_buffer_get_fd(task->output);
    if (ctx->part_bytepos)
        mpp_dev_set_reg_offset(ctx->dev, 5, ctx->part_bytepos);

    regs[14] = (1 << 31) |
               (0 << 30) |
               (0 << 29) |
               (mcu_w << 19) |
               (part_enc_mcu_h << 10) |
               (1 << 3) | (2 << 1) | 1;

    regs[20] = part_not_end << 24 | jpege_restart_marker[ctx->rst_marker_idx & 7];
    ctx->rst_marker_idx++;

    hal_jpege_vepu1_set_extra_info(ctx->dev, syntax, mcu_y);
    ctx->mcu_y += part_enc_mcu_h;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = ctx->reg_size;

        wr_cfg.reg = ctx->regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = ctx->regs_out;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_jpege_dbg_func("leave part start %p\n", hal);
    (void)task;
    return ret;
}